

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int pmbtoken_pst1_hash_s(EC_GROUP *group,EC_JACOBIAN *out,EC_AFFINE *t,uint8_t *s)

{
  int iVar1;
  size_t local_90;
  size_t len;
  uint8_t *buf;
  CBB cbb;
  uint8_t auStack_48 [4];
  int ret;
  uint8_t kHashSLabel [23];
  uint8_t *s_local;
  EC_AFFINE *t_local;
  EC_JACOBIAN *out_local;
  EC_GROUP *group_local;
  
  auStack_48[0] = 'P';
  auStack_48[1] = 'M';
  auStack_48[2] = 'B';
  auStack_48[3] = 'T';
  ret._0_1_ = 'o';
  ret._1_1_ = 'k';
  ret._2_1_ = 'e';
  ret._3_1_ = 'n';
  builtin_memcpy(kHashSLabel,"s PST V1 HashS",0xf);
  cbb.u._28_4_ = 0;
  len = 0;
  iVar1 = CBB_init((CBB *)&buf,0);
  if ((((iVar1 != 0) && (iVar1 = point_to_cbb((CBB *)&buf,group,t), iVar1 != 0)) &&
      (iVar1 = CBB_add_bytes((CBB *)&buf,s,0x40), iVar1 != 0)) &&
     ((iVar1 = CBB_finish((CBB *)&buf,(uint8_t **)&len,&local_90), iVar1 != 0 &&
      (iVar1 = ec_hash_to_curve_p384_xmd_sha384_sswu
                         (group,out,auStack_48,0x17,(uint8_t *)len,local_90), iVar1 != 0)))) {
    cbb.u._28_4_ = 1;
  }
  OPENSSL_free((void *)len);
  CBB_cleanup((CBB *)&buf);
  return cbb.u._28_4_;
}

Assistant:

static int pmbtoken_pst1_hash_s(const EC_GROUP *group, EC_JACOBIAN *out,
                                const EC_AFFINE *t,
                                const uint8_t s[TRUST_TOKEN_NONCE_SIZE]) {
  const uint8_t kHashSLabel[] = "PMBTokens PST V1 HashS";
  int ret = 0;
  CBB cbb;
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) || !point_to_cbb(&cbb, group, t) ||
      !CBB_add_bytes(&cbb, s, TRUST_TOKEN_NONCE_SIZE) ||
      !CBB_finish(&cbb, &buf, &len) ||
      !ec_hash_to_curve_p384_xmd_sha384_sswu(group, out, kHashSLabel,
                                             sizeof(kHashSLabel), buf, len)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(buf);
  CBB_cleanup(&cbb);
  return ret;
}